

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O3

Edge * __thiscall
S2LaxPolygonShape::chain_edge(Edge *__return_storage_ptr__,S2LaxPolygonShape *this,int i,int j)

{
  VType VVar1;
  int iVar2;
  int iVar3;
  Vector3<double> *pVVar4;
  Vector3<double> *pVVar5;
  S2LogMessage local_30;
  
  if (i < *(int *)&(this->super_S2Shape).field_0xc) {
    iVar2 = num_loop_vertices(this,i);
    if (j < iVar2) {
      iVar3 = num_loop_vertices(this,i);
      iVar2 = 0;
      if (j + 1 != iVar3) {
        iVar2 = j + 1;
      }
      if (*(int *)&(this->super_S2Shape).field_0xc == 1) {
        pVVar4 = (this->vertices_)._M_t.
                 super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
                 super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl;
        pVVar5 = pVVar4 + j;
      }
      else {
        pVVar4 = (this->vertices_)._M_t.
                 super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
                 super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl;
        pVVar5 = pVVar4 + (int)(j + (this->field_2).cumulative_vertices_[i]);
        iVar2 = iVar2 + (this->field_2).cumulative_vertices_[i];
      }
      (__return_storage_ptr__->v0).c_[2] = pVVar5->c_[2];
      VVar1 = pVVar5->c_[1];
      (__return_storage_ptr__->v0).c_[0] = pVVar5->c_[0];
      (__return_storage_ptr__->v0).c_[1] = VVar1;
      VVar1 = pVVar4[iVar2].c_[1];
      (__return_storage_ptr__->v1).c_[0] = pVVar4[iVar2].c_[0];
      (__return_storage_ptr__->v1).c_[1] = VVar1;
      (__return_storage_ptr__->v1).c_[2] = pVVar4[iVar2].c_[2];
      return __return_storage_ptr__;
    }
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
               ,0xd4,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_30.stream_,"Check failed: (j) < (num_loop_vertices(i)) ",0x2b);
  }
  else {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
               ,0xd3,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_30.stream_,"Check failed: (i) < (num_loops()) ",0x22);
  }
  abort();
}

Assistant:

S2Shape::Edge S2LaxPolygonShape::chain_edge(int i, int j) const {
  S2_DCHECK_LT(i, num_loops());
  S2_DCHECK_LT(j, num_loop_vertices(i));
  int n = num_loop_vertices(i);
  int k = (j + 1 == n) ? 0 : j + 1;
  if (num_loops() == 1) {
    return Edge(vertices_[j], vertices_[k]);
  } else {
    int base = cumulative_vertices_[i];
    return Edge(vertices_[base + j], vertices_[base + k]);
  }
}